

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyb_gga_xc_b3lyp.c
# Opt level: O3

void mcm1_set_ext_params(xc_func_type *p,double *ext_params)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  dVar2 = get_ext_param(p,ext_params,0);
  dVar3 = get_ext_param(p,ext_params,1);
  dVar4 = get_ext_param(p,ext_params,2);
  dVar5 = get_ext_param(p,ext_params,3);
  dVar6 = get_ext_param(p,ext_params,4);
  dVar7 = get_ext_param(p,ext_params,5);
  pdVar1 = p->mix_coef;
  *pdVar1 = (dVar5 - dVar4) * dVar2;
  pdVar1[1] = dVar4 * dVar2;
  pdVar1[2] = dVar7 - dVar6;
  pdVar1[3] = dVar6;
  p->cam_alpha = dVar3;
  return;
}

Assistant:

static void
mcm1_set_ext_params(xc_func_type *p, const double *ext_params)
{
  double p1, p2, p3, p4, p5, p6;

  assert(p != NULL);

  p1 = get_ext_param(p, ext_params, 0);
  p2 = get_ext_param(p, ext_params, 1);
  p3 = get_ext_param(p, ext_params, 2);
  p4 = get_ext_param(p, ext_params, 3);
  p5 = get_ext_param(p, ext_params, 4);
  p6 = get_ext_param(p, ext_params, 5);

  p->mix_coef[0] = p1*(p4 - p3);
  p->mix_coef[1] = p1*p3;
  p->mix_coef[2] = p6 - p5;
  p->mix_coef[3] = p5;

  p->cam_alpha = p2;
}